

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_fd.c
# Opt level: O3

void file_free(file_conflict *file)

{
  heap_data *phVar1;
  heap_data *__ptr;
  
  __ptr = (file->xattr).first;
  while (__ptr != (heap_data *)0x0) {
    phVar1 = __ptr->next;
    free(__ptr);
    __ptr = phVar1;
  }
  archive_string_free(&file->parentdir);
  archive_string_free(&file->basename);
  archive_string_free(&file->symlink);
  archive_string_free(&file->script);
  archive_entry_free(file->entry);
  free(file);
  return;
}

Assistant:

static int
file_free(struct archive *a, void *client_data)
{
	struct write_fd_data	*mine = (struct write_fd_data *)client_data;

	(void)a; /* UNUSED */
	if (mine == NULL)
		return (ARCHIVE_OK);
	free(mine);
	return (ARCHIVE_OK);
}